

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::convert
          (IEEEFloat *this,fltSemantics *toSemantics,roundingMode rounding_mode,bool *losesInfo)

{
  fltSemantics *pfVar1;
  bool bVar2;
  bool bVar3;
  uint parts;
  uint parts_00;
  uint uVar4;
  integerPart *piVar5;
  ulong uVar6;
  WordType *dst;
  integerPart local_60;
  integerPart newPart;
  integerPart *newParts;
  int exponentChange;
  bool X86SpecialNan;
  fltSemantics *fromSemantics;
  opStatus local_38;
  int shift;
  opStatus fs;
  uint oldPartCount;
  uint newPartCount;
  lostFraction lostFraction;
  bool *losesInfo_local;
  roundingMode rounding_mode_local;
  fltSemantics *toSemantics_local;
  IEEEFloat *this_local;
  
  pfVar1 = this->semantics;
  oldPartCount = 0;
  parts = partCountForBits(toSemantics->precision + 1);
  parts_00 = partCount(this);
  fromSemantics._4_4_ = toSemantics->precision - pfVar1->precision;
  bVar2 = false;
  if ((((pfVar1 == (fltSemantics *)semX87DoubleExtended) &&
       (toSemantics != (fltSemantics *)semX87DoubleExtended)) && ((this->field_0x12 & 7) == 1)) &&
     ((piVar5 = significandParts(this), (*piVar5 & 0x8000000000000000) == 0 ||
      (piVar5 = significandParts(this), (*piVar5 & 0x4000000000000000) == 0)))) {
    bVar2 = true;
  }
  if (((int)fromSemantics._4_4_ < 0) && (bVar3 = isFiniteNonZero(this), bVar3)) {
    uVar4 = significandMSB(this);
    newParts._0_4_ = (uVar4 + 1) - pfVar1->precision;
    if ((int)((int)this->exponent + (uint)newParts) < (int)toSemantics->minExponent) {
      newParts._0_4_ = (int)toSemantics->minExponent - (int)this->exponent;
    }
    if ((int)(uint)newParts < (int)fromSemantics._4_4_) {
      newParts._0_4_ = fromSemantics._4_4_;
    }
    if ((int)(uint)newParts < 0) {
      fromSemantics._4_4_ = fromSemantics._4_4_ - (uint)newParts;
      this->exponent = this->exponent + (short)(uint)newParts;
    }
  }
  if (((int)fromSemantics._4_4_ < 0) &&
     ((bVar3 = isFiniteNonZero(this), bVar3 || ((this->field_0x12 & 7) == 1)))) {
    piVar5 = significandParts(this);
    oldPartCount = shiftRight(piVar5,parts_00,-fromSemantics._4_4_);
  }
  if (parts_00 < parts) {
    uVar6 = SUB168(ZEXT416(parts) * ZEXT816(8),0);
    if (SUB168(ZEXT416(parts) * ZEXT816(8),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    dst = (WordType *)operator_new__(uVar6);
    APInt::tcSet(dst,0,parts);
    bVar3 = isFiniteNonZero(this);
    if ((bVar3) || ((this->field_0x12 & 7) == 1)) {
      piVar5 = significandParts(this);
      APInt::tcAssign(dst,piVar5,parts_00);
    }
    freeSignificand(this);
    (this->significand).parts = dst;
  }
  else if ((parts == 1) && (parts_00 != 1)) {
    local_60 = 0;
    bVar3 = isFiniteNonZero(this);
    if ((bVar3) || ((this->field_0x12 & 7) == 1)) {
      piVar5 = significandParts(this);
      local_60 = *piVar5;
    }
    freeSignificand(this);
    (this->significand).part = local_60;
  }
  this->semantics = toSemantics;
  if ((0 < (int)fromSemantics._4_4_) &&
     ((bVar3 = isFiniteNonZero(this), bVar3 || ((this->field_0x12 & 7) == 1)))) {
    piVar5 = significandParts(this);
    APInt::tcShiftLeft(piVar5,parts,fromSemantics._4_4_);
  }
  bVar3 = isFiniteNonZero(this);
  if (bVar3) {
    local_38 = normalize(this,rounding_mode,oldPartCount);
    *losesInfo = local_38 != opOK;
  }
  else {
    if ((this->field_0x12 & 7) == 1) {
      bVar3 = true;
      if (oldPartCount == 0) {
        bVar3 = bVar2;
      }
      *losesInfo = bVar3;
      if ((bVar2 == false) && (this->semantics == (fltSemantics *)semX87DoubleExtended)) {
        piVar5 = significandParts(this);
        APInt::tcSetBit(piVar5,this->semantics->precision - 1);
      }
    }
    else {
      *losesInfo = false;
    }
    local_38 = opOK;
  }
  return local_38;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convert(const fltSemantics &toSemantics,
                                       roundingMode rounding_mode,
                                       bool *losesInfo) {
  lostFraction lostFraction;
  unsigned int newPartCount, oldPartCount;
  opStatus fs;
  int shift;
  const fltSemantics &fromSemantics = *semantics;

  lostFraction = lfExactlyZero;
  newPartCount = partCountForBits(toSemantics.precision + 1);
  oldPartCount = partCount();
  shift = toSemantics.precision - fromSemantics.precision;

  bool X86SpecialNan = false;
  if (&fromSemantics == &semX87DoubleExtended &&
      &toSemantics != &semX87DoubleExtended && category == fcNaN &&
      (!(*significandParts() & 0x8000000000000000ULL) ||
       !(*significandParts() & 0x4000000000000000ULL))) {
    // x86 has some unusual NaNs which cannot be represented in any other
    // format; note them here.
    X86SpecialNan = true;
  }

  // If this is a truncation of a denormal number, and the target semantics
  // has larger exponent range than the source semantics (this can happen
  // when truncating from PowerPC double-double to double format), the
  // right shift could lose result mantissa bits.  Adjust exponent instead
  // of performing excessive shift.
  if (shift < 0 && isFiniteNonZero()) {
    int exponentChange = significandMSB() + 1 - fromSemantics.precision;
    if (exponent + exponentChange < toSemantics.minExponent)
      exponentChange = toSemantics.minExponent - exponent;
    if (exponentChange < shift)
      exponentChange = shift;
    if (exponentChange < 0) {
      shift -= exponentChange;
      exponent += exponentChange;
    }
  }

  // If this is a truncation, perform the shift before we narrow the storage.
  if (shift < 0 && (isFiniteNonZero() || category==fcNaN))
    lostFraction = shiftRight(significandParts(), oldPartCount, -shift);

  // Fix the storage so it can hold to new value.
  if (newPartCount > oldPartCount) {
    // The new type requires more storage; make it available.
    integerPart *newParts;
    newParts = new integerPart[newPartCount];
    APInt::tcSet(newParts, 0, newPartCount);
    if (isFiniteNonZero() || category==fcNaN)
      APInt::tcAssign(newParts, significandParts(), oldPartCount);
    freeSignificand();
    significand.parts = newParts;
  } else if (newPartCount == 1 && oldPartCount != 1) {
    // Switch to built-in storage for a single part.
    integerPart newPart = 0;
    if (isFiniteNonZero() || category==fcNaN)
      newPart = significandParts()[0];
    freeSignificand();
    significand.part = newPart;
  }

  // Now that we have the right storage, switch the semantics.
  semantics = &toSemantics;

  // If this is an extension, perform the shift now that the storage is
  // available.
  if (shift > 0 && (isFiniteNonZero() || category==fcNaN))
    APInt::tcShiftLeft(significandParts(), newPartCount, shift);

  if (isFiniteNonZero()) {
    fs = normalize(rounding_mode, lostFraction);
    *losesInfo = (fs != opOK);
  } else if (category == fcNaN) {
    *losesInfo = lostFraction != lfExactlyZero || X86SpecialNan;

    // For x87 extended precision, we want to make a NaN, not a special NaN if
    // the input wasn't special either.
    if (!X86SpecialNan && semantics == &semX87DoubleExtended)
      APInt::tcSetBit(significandParts(), semantics->precision - 1);

    // gcc forces the Quiet bit on, which means (float)(double)(float_sNan)
    // does not give you back the same bits.  This is dubious, and we
    // don't currently do it.  You're really supposed to get
    // an invalid operation signal at runtime, but nobody does that.
    fs = opOK;
  } else {
    *losesInfo = false;
    fs = opOK;
  }

  return fs;
}